

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O2

void nukedopn2_set_options(void *chip,UINT32 flags)

{
  undefined4 uVar1;
  uint uVar2;
  
  uVar2 = flags >> 2 & 0xc;
  uVar1 = *(undefined4 *)(&DAT_00166580 + uVar2);
  *(undefined4 *)((long)chip + 0x4f4) = *(undefined4 *)(&DAT_00166570 + uVar2);
  *(undefined4 *)((long)chip + 0x4f8) = uVar1;
  return;
}

Assistant:

void nukedopn2_set_options(void *chip, UINT32 flags)
{
    ym3438_t* opn2 = (ym3438_t*)chip;
    switch ((flags >> 4) & 0x03)
    {
    case 0x00: // YM2612
    default:
        NOPN2_SetChipType(opn2, ym3438_mode_ym2612);
        break;
    case 0x01: // ASIC YM3438
        NOPN2_SetChipType(opn2, ym3438_mode_readmode);
        break;
    case 0x02: // Discrete YM3438
        NOPN2_SetChipType(opn2, ym3438_mode_ym2612 | ym3438_mode_readmode);
        break;
    case 0x03: // YM2612 + MD1 filter (temporary hack)
        NOPN2_SetChipType(opn2, ym3438_mode_ym2612 | 0x10);
        break;
    }
}